

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.hpp
# Opt level: O0

void __thiscall ot::commissioner::CommissionerImpl::~CommissionerImpl(CommissionerImpl *this)

{
  CommissionerImpl *this_local;
  
  ~CommissionerImpl(this);
  operator_delete(this);
  return;
}

Assistant:

~CommissionerImpl() override = default;